

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::Finalize<duckdb::BitState<unsigned_int>,int,duckdb::BitXorOperation>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  VectorType VVar1;
  BitState<unsigned_int> *in_RCX;
  Vector *in_RDX;
  AggregateInputData *in_RSI;
  Vector *in_RDI;
  long in_R8;
  idx_t i;
  AggregateFinalizeData finalize_data_1;
  int *rdata_1;
  BitState<unsigned_int> **sdata_1;
  AggregateFinalizeData finalize_data;
  int *rdata;
  BitState<unsigned_int> **sdata;
  int *in_stack_ffffffffffffff78;
  BitState<unsigned_int> *in_stack_ffffffffffffff80;
  BitState<unsigned_int> *state;
  AggregateFinalizeData local_78;
  int *local_60;
  BitState<unsigned_int> **local_58;
  AggregateFinalizeData local_50;
  int *local_38;
  BitState<unsigned_int> **local_30;
  long local_28;
  BitState<unsigned_int> *local_20;
  Vector *local_18;
  AggregateInputData *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    local_30 = ConstantVector::GetData<duckdb::BitState<unsigned_int>*>((Vector *)0x98bbb0);
    local_38 = ConstantVector::GetData<int>((Vector *)0x98bbbf);
    AggregateFinalizeData::AggregateFinalizeData(&local_50,local_18,local_10);
    BitwiseOperation::Finalize<int,duckdb::BitState<unsigned_int>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(AggregateFinalizeData *)0x98bbef
              );
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    local_58 = FlatVector::GetData<duckdb::BitState<unsigned_int>*>((Vector *)0x98bc0d);
    local_60 = FlatVector::GetData<int>((Vector *)0x98bc1c);
    AggregateFinalizeData::AggregateFinalizeData(&local_78,local_18,local_10);
    for (state = (BitState<unsigned_int> *)0x0; state < local_20;
        state = (BitState<unsigned_int> *)&state->field_0x1) {
      local_78.result_idx = (idx_t)(&state->is_set + local_28);
      BitwiseOperation::Finalize<int,duckdb::BitState<unsigned_int>>
                (state,in_stack_ffffffffffffff78,(AggregateFinalizeData *)0x98bc82);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}